

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyle.cpp
# Opt level: O2

void __thiscall QStyle::QStyle(QStyle *this)

{
  QStylePrivate *this_00;
  
  this_00 = (QStylePrivate *)operator_new(0x98);
  QStylePrivate::QStylePrivate(this_00);
  QObject::QObject(&this->super_QObject,(QObjectPrivate *)this_00,(QObject *)0x0);
  *(undefined ***)this = &PTR_metaObject_007c38f0;
  *(QStyle **)(*(long *)&this->field_0x8 + 0x78) = this;
  return;
}

Assistant:

QStyle::QStyle()
    : QObject(*new QStylePrivate)
{
    Q_D(QStyle);
    d->proxyStyle = this;
}